

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                 (RepeatedField<long> *value,size_t tag_size,CachedSize *cached_size)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong *puVar4;
  ulong uVar5;
  size_t sVar6;
  int index;
  long lVar7;
  
  bVar2 = RepeatedField<long>::empty(value);
  if (bVar2) {
    if (cached_size->atom_ != 0) {
      cached_size->atom_ = 0;
    }
    sVar6 = 0;
  }
  else {
    iVar3 = RepeatedField<long>::size(value);
    lVar7 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (index = 0; iVar3 != index; index = index + 1) {
      puVar4 = (ulong *)RepeatedField<long>::Get(value,index);
      lVar1 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar1 * 9 + 0x49U >> 6);
    }
    cached_size->atom_ = (int)lVar7;
    uVar5 = (long)(int)lVar7 | 1;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar6 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + tag_size + lVar7;
  }
  return sVar6;
}

Assistant:

size_t WireFormatLite::Int64SizeWithPackedTagSize(
    const RepeatedField<int64_t>& value, size_t tag_size,
    const internal::CachedSize& cached_size) {
  if (value.empty()) {
    cached_size.Set(0);
    return 0;
  }
  size_t res;
  PROTOBUF_ALWAYS_INLINE_CALL res = Int64Size(value);
  cached_size.SetNonZero(ToCachedSize(res));
  return tag_size + res + Int32Size(static_cast<int32_t>(res));
}